

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_layer.c
# Opt level: O0

REF_STATUS ref_layer_recon(REF_LAYER ref_layer,REF_GRID ref_grid)

{
  REF_CELL ref_cell_00;
  REF_NODE pRVar1;
  REF_STATUS RVar2;
  uint uVar3;
  REF_INT local_c8;
  REF_INT local_c0;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT node1;
  REF_INT node0;
  REF_BOOL has_side;
  REF_INT nodes [27];
  REF_INT cell;
  REF_CELL layer_edge;
  REF_NODE layer_node;
  REF_CELL ref_cell;
  REF_GRID ref_grid_local;
  REF_LAYER ref_layer_local;
  
  ref_cell_00 = ref_grid->cell[8];
  pRVar1 = ref_layer->ref_grid->node;
  unique0x00012000 = ref_layer->ref_grid->cell[0];
  nodes[0x19] = 0;
  do {
    if (stack0xffffffffffffffc8->max <= nodes[0x19]) {
      return 0;
    }
    RVar2 = ref_cell_nodes(stack0xffffffffffffffc8,nodes[0x19],&node0);
    if (RVar2 == 0) {
      if (((node0 < 0) || (pRVar1->max <= node0)) || (pRVar1->global[node0] < 0)) {
        local_c0 = -1;
      }
      else {
        local_c0 = (REF_INT)pRVar1->global[node0];
      }
      if (((has_side < 0) || (pRVar1->max <= has_side)) || (pRVar1->global[has_side] < 0)) {
        local_c8 = -1;
      }
      else {
        local_c8 = (REF_INT)pRVar1->global[has_side];
      }
      uVar3 = ref_cell_has_side(ref_cell_00,local_c0,local_c8,&node1);
      if (uVar3 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
               0x156,"ref_layer_recon",(ulong)uVar3,"side?");
        return uVar3;
      }
      if (node1 == 0) {
        if (ref_layer->verbose != 0) {
          printf("need one\n");
        }
      }
      else if (ref_layer->verbose != 0) {
        printf("got one\n");
      }
    }
    nodes[0x19] = nodes[0x19] + 1;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_layer_recon(REF_LAYER ref_layer, REF_GRID ref_grid) {
  REF_CELL ref_cell = ref_grid_tet(ref_grid);
  REF_NODE layer_node = ref_grid_node(ref_layer_grid(ref_layer));
  REF_CELL layer_edge = ref_grid_edg(ref_layer_grid(ref_layer));
  REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_BOOL has_side;
  REF_INT node0, node1;

  each_ref_cell_valid_cell_with_nodes(layer_edge, cell, nodes) {
    node0 = (REF_INT)ref_node_global(layer_node, nodes[0]);
    node1 = (REF_INT)ref_node_global(layer_node, nodes[1]);
    RSS(ref_cell_has_side(ref_cell, node0, node1, &has_side), "side?");
    if (has_side) {
      if (ref_layer->verbose) printf("got one\n");
    } else {
      if (ref_layer->verbose) printf("need one\n");
    }
  }

  return REF_SUCCESS;
}